

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O2

void av1_dr_prediction_z2_avx2
               (uint8_t *dst,ptrdiff_t stride,int bw,int bh,uint8_t *above,uint8_t *left,
               int upsample_above,int upsample_left,int dx,int dy)

{
  ushort uVar1;
  long lVar2;
  short sVar3;
  uint uVar4;
  ulong uVar5;
  byte bVar6;
  undefined4 uVar7;
  int iVar8;
  int j;
  uint uVar9;
  undefined4 uVar10;
  int iVar11;
  long lVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  uint uVar16;
  undefined4 uVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  undefined4 uVar21;
  uint uVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 in_ZMM4 [64];
  ushort uVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  undefined1 auVar51 [32];
  undefined1 auVar50 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  uint8_t *local_58;
  
  auVar29 = _DAT_00477310;
  auVar28 = _DAT_004772f0;
  auVar26._0_2_ = (undefined2)dy;
  auVar50 = in_ZMM4._0_16_;
  bVar6 = (byte)upsample_above;
  local_58 = dst;
  if (bw == 8) {
    iVar8 = -1 << (bVar6 & 0x1f);
    auVar44._0_2_ = (undefined2)(-1 << ((byte)upsample_left & 0x1f));
    auVar44._2_2_ = auVar44._0_2_;
    auVar44._4_2_ = auVar44._0_2_;
    auVar44._6_2_ = auVar44._0_2_;
    auVar44._8_2_ = auVar44._0_2_;
    auVar44._10_2_ = auVar44._0_2_;
    auVar44._12_2_ = auVar44._0_2_;
    auVar44._14_2_ = auVar44._0_2_;
    auVar29._2_2_ = auVar26._0_2_;
    auVar29._0_2_ = auVar26._0_2_;
    auVar29._4_2_ = auVar26._0_2_;
    auVar29._6_2_ = auVar26._0_2_;
    auVar29._8_2_ = auVar26._0_2_;
    auVar29._10_2_ = auVar26._0_2_;
    auVar29._12_2_ = auVar26._0_2_;
    auVar29._14_2_ = auVar26._0_2_;
    auVar26 = vpmullw_avx(auVar29,_DAT_004772d0);
    auVar29 = vpsrlw_avx(auVar26,1);
    auVar29 = vpand_avx(auVar29,_DAT_004772e0);
    if (bh < 1) {
      bh = 0;
    }
    iVar20 = -dx;
    auVar50 = vpcmpeqd_avx(auVar50,auVar50);
    sVar3 = 0;
    iVar19 = dx;
    while (bVar23 = bh != 0, bh = bh + -1, bVar23) {
      uVar9 = iVar20 >> (6 - bVar6 & 0x1f);
      iVar11 = (int)(~uVar9 + iVar8) >> (bVar6 & 0x1f);
      if (iVar8 + -1 <= (int)uVar9) {
        iVar11 = 0;
      }
      uVar18 = (int)((iVar8 + upsample_above) - uVar9) >> (bVar6 & 0x1f);
      if ((int)uVar18 < 1) {
        uVar18 = 0;
      }
      uVar5 = (ulong)uVar18;
      if (7 < (int)uVar18) {
        uVar5 = 8;
      }
      auVar38 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      auVar35 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      auVar40 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      if (iVar11 < 8) {
        auVar46 = *(undefined1 (*) [16])(above + (long)iVar11 + (long)(int)uVar9);
        auVar49._0_2_ = (undefined2)iVar19;
        auVar49._2_2_ = auVar49._0_2_;
        auVar49._4_2_ = auVar49._0_2_;
        auVar49._6_2_ = auVar49._0_2_;
        auVar49._8_2_ = auVar49._0_2_;
        auVar49._10_2_ = auVar49._0_2_;
        auVar49._12_2_ = auVar49._0_2_;
        auVar49._14_2_ = auVar49._0_2_;
        auVar49 = vpsubw_avx(auVar28,auVar49);
        if (upsample_above == 0) {
          auVar54 = vpsrldq_avx(auVar46,1);
          auVar55 = vpshufb_avx(auVar46,(undefined1  [16])LoadMaskx[iVar11]);
          auVar46 = vpshufb_avx(auVar54,(undefined1  [16])LoadMaskx[iVar11]);
        }
        else {
          auVar55 = vpshufb_avx(auVar46,(undefined1  [16])EvenOddMaskx[iVar11]);
          auVar46 = vpsrldq_avx(auVar55,8);
          auVar49 = vpsllw_avx(auVar49,ZEXT416((uint)upsample_above));
        }
        auVar49 = vpsrlw_avx(auVar49,1);
        auVar54._8_8_ = 0x1f001f001f001f;
        auVar54._0_8_ = 0x1f001f001f001f;
        auVar49 = vpand_avx(auVar54,auVar49);
        auVar38._0_16_ = ZEXT116(0) * auVar44 + ZEXT116(1) * auVar49;
        auVar38._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar44;
        auVar49 = vpmovzxbw_avx(auVar55);
        auVar40._0_16_ = ZEXT116(0) * auVar44 + ZEXT116(1) * auVar49;
        auVar40._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar44;
        auVar46 = vpmovzxbw_avx(auVar46);
        auVar35._0_16_ = ZEXT116(0) * auVar44 + ZEXT116(1) * auVar46;
        auVar35._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar44;
      }
      auVar39 = auVar35;
      auVar37 = auVar38;
      auVar47 = auVar40;
      if ((int)uVar9 < iVar8) {
        auVar46._2_2_ = sVar3;
        auVar46._0_2_ = sVar3;
        auVar46._4_2_ = sVar3;
        auVar46._6_2_ = sVar3;
        auVar46._8_2_ = sVar3;
        auVar46._10_2_ = sVar3;
        auVar46._12_2_ = sVar3;
        auVar46._14_2_ = sVar3;
        auVar46 = vpaddw_avx(auVar46,auVar26);
        auVar49 = auVar29;
        if (upsample_left != 0) {
          auVar49 = vpsllw_avx(auVar46,ZEXT416((uint)upsample_left));
          auVar49 = vpsrlw_avx(auVar49,1);
          auVar55._8_8_ = 0x1f001f001f001f;
          auVar55._0_8_ = 0x1f001f001f001f;
          auVar49 = vpand_avx(auVar49,auVar55);
        }
        auVar55 = vpsraw_avx(auVar46,ZEXT416(6 - upsample_left));
        auVar46 = vpcmpgtw_avx(auVar44,auVar55);
        auVar46 = vpandn_avx(auVar46,auVar55);
        uVar13 = vpextrw_avx(auVar46,1);
        uVar21 = vpextrw_avx(auVar46,2);
        uVar10 = vpextrw_avx(auVar46,3);
        uVar14 = vpextrw_avx(auVar46,4);
        uVar15 = vpextrw_avx(auVar46,5);
        uVar17 = vpextrw_avx(auVar46,6);
        uVar7 = vpextrw_avx(auVar46,7);
        auVar55 = vpinsrw_avx(ZEXT116(left[auVar46._0_2_]),(uint)left[(short)uVar13],1);
        auVar55 = vpinsrw_avx(auVar55,(uint)left[(short)uVar21],2);
        auVar55 = vpinsrw_avx(auVar55,(uint)left[(short)uVar10],3);
        auVar55 = vpinsrw_avx(auVar55,(uint)left[(short)uVar14],4);
        auVar55 = vpinsrw_avx(auVar55,(uint)left[(short)uVar15],5);
        auVar55 = vpinsrw_avx(auVar55,(uint)left[(short)uVar17],6);
        auVar55 = vpinsrw_avx(auVar55,(uint)left[(short)uVar7],7);
        auVar46 = vpsubw_avx(auVar46,auVar50);
        uVar13 = vpextrw_avx(auVar46,1);
        uVar14 = vpextrw_avx(auVar46,2);
        uVar15 = vpextrw_avx(auVar46,3);
        uVar17 = vpextrw_avx(auVar46,4);
        uVar7 = vpextrw_avx(auVar46,5);
        uVar21 = vpextrw_avx(auVar46,6);
        uVar10 = vpextrw_avx(auVar46,7);
        auVar46 = vpinsrw_avx(ZEXT116(left[auVar46._0_2_]),(uint)left[(short)uVar13],1);
        auVar46 = vpinsrw_avx(auVar46,(uint)left[(short)uVar14],2);
        auVar46 = vpinsrw_avx(auVar46,(uint)left[(short)uVar15],3);
        auVar46 = vpinsrw_avx(auVar46,(uint)left[(short)uVar17],4);
        auVar46 = vpinsrw_avx(auVar46,(uint)left[(short)uVar7],5);
        auVar46 = vpinsrw_avx(auVar46,(uint)left[(short)uVar21],6);
        auVar46 = vpinsrw_avx(auVar46,(uint)left[(short)uVar10],7);
        auVar47._0_16_ = ZEXT116(0) * auVar55 + ZEXT116(1) * auVar40._0_16_;
        auVar47._16_16_ = ZEXT116(0) * auVar40._16_16_ + ZEXT116(1) * auVar55;
        auVar39._0_16_ = ZEXT116(0) * auVar46 + ZEXT116(1) * auVar35._0_16_;
        auVar39._16_16_ = ZEXT116(0) * auVar35._16_16_ + ZEXT116(1) * auVar46;
        auVar37._0_16_ = ZEXT116(0) * auVar49 + ZEXT116(1) * auVar38._0_16_;
        auVar37._16_16_ = ZEXT116(0) * auVar38._16_16_ + ZEXT116(1) * auVar49;
      }
      auVar38 = vpsubw_avx2(auVar39,auVar47);
      auVar38 = vpmullw_avx2(auVar38,auVar37);
      auVar40 = vpsllw_avx2(auVar47,5);
      auVar38 = vpaddw_avx2(auVar40,auVar38);
      auVar41._8_2_ = 0x10;
      auVar41._0_8_ = 0x10001000100010;
      auVar41._10_2_ = 0x10;
      auVar41._12_2_ = 0x10;
      auVar41._14_2_ = 0x10;
      auVar41._16_2_ = 0x10;
      auVar41._18_2_ = 0x10;
      auVar41._20_2_ = 0x10;
      auVar41._22_2_ = 0x10;
      auVar41._24_2_ = 0x10;
      auVar41._26_2_ = 0x10;
      auVar41._28_2_ = 0x10;
      auVar41._30_2_ = 0x10;
      auVar38 = vpaddw_avx2(auVar41,auVar38);
      auVar38 = vpsrlw_avx2(auVar38,5);
      auVar46 = vpackuswb_avx(auVar38._0_16_,auVar38._0_16_);
      auVar49 = vpackuswb_avx(auVar38._16_16_,auVar38._16_16_);
      auVar46 = vpblendvb_avx(auVar46,auVar49,*(undefined1 (*) [16])BaseMask[uVar5]);
      *(long *)local_58 = auVar46._0_8_;
      local_58 = local_58 + stride;
      sVar3 = sVar3 + 0x40;
      iVar20 = iVar20 - dx;
      iVar19 = iVar19 + dx;
    }
  }
  else if (bw == 4) {
    iVar8 = -1 << (bVar6 & 0x1f);
    auVar24._0_2_ = (undefined2)(-1 << ((byte)upsample_left & 0x1f));
    auVar24._2_2_ = auVar24._0_2_;
    auVar24._4_2_ = auVar24._0_2_;
    auVar24._6_2_ = auVar24._0_2_;
    auVar24._8_2_ = auVar24._0_2_;
    auVar24._10_2_ = auVar24._0_2_;
    auVar24._12_2_ = auVar24._0_2_;
    auVar24._14_2_ = auVar24._0_2_;
    auVar26._2_2_ = auVar26._0_2_;
    auVar26._4_2_ = auVar26._0_2_;
    auVar26._6_2_ = auVar26._0_2_;
    auVar26._8_2_ = auVar26._0_2_;
    auVar26._10_2_ = auVar26._0_2_;
    auVar26._12_2_ = auVar26._0_2_;
    auVar26._14_2_ = auVar26._0_2_;
    auVar26 = vpmullw_avx(auVar26,_DAT_00477300);
    auVar28 = vpsrlw_avx(auVar26,1);
    auVar28 = vpand_avx(auVar28,_DAT_004772e0);
    if (bh < 1) {
      bh = 0;
    }
    iVar20 = -dx;
    auVar50 = vpcmpeqd_avx(auVar50,auVar50);
    auVar33._8_8_ = 0x1f001f001f001f;
    auVar33._0_8_ = 0x1f001f001f001f;
    auVar36._8_2_ = 0x10;
    auVar36._0_8_ = 0x10001000100010;
    auVar36._10_2_ = 0x10;
    auVar36._12_2_ = 0x10;
    auVar36._14_2_ = 0x10;
    sVar3 = 0;
    iVar19 = dx;
    while (bVar23 = bh != 0, bh = bh + -1, bVar23) {
      uVar9 = iVar20 >> (6 - bVar6 & 0x1f);
      iVar11 = (int)(~uVar9 + iVar8) >> (bVar6 & 0x1f);
      if (iVar8 + -1 <= (int)uVar9) {
        iVar11 = 0;
      }
      uVar18 = (int)((iVar8 + upsample_above) - uVar9) >> (bVar6 & 0x1f);
      if ((int)uVar18 < 1) {
        uVar18 = 0;
      }
      if (3 < (int)uVar18) {
        uVar18 = 4;
      }
      auVar44 = (undefined1  [16])0x0;
      auVar49 = (undefined1  [16])0x0;
      auVar46 = (undefined1  [16])0x0;
      if (iVar11 < 4) {
        auVar43._0_2_ = (undefined2)iVar19;
        auVar43._2_2_ = auVar43._0_2_;
        auVar43._4_2_ = auVar43._0_2_;
        auVar43._6_2_ = auVar43._0_2_;
        auVar43._8_2_ = auVar43._0_2_;
        auVar43._10_2_ = auVar43._0_2_;
        auVar43._12_2_ = auVar43._0_2_;
        auVar43._14_2_ = auVar43._0_2_;
        auVar44 = vpsubw_avx(auVar29,auVar43);
        if (upsample_above == 0) {
          auVar46 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)iVar11 + (long)(int)uVar9),
                                (undefined1  [16])LoadMaskx[iVar11]);
          auVar49 = vpsrldq_avx(auVar46,1);
        }
        else {
          auVar46 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)iVar11 + (long)(int)uVar9),
                                (undefined1  [16])EvenOddMaskx[iVar11]);
          auVar49 = vpsrldq_avx(auVar46,8);
          auVar44 = vpsllw_avx(auVar44,ZEXT416((uint)upsample_above));
        }
        auVar44 = vpsrlw_avx(auVar44,1);
        auVar44 = vpand_avx(auVar44,auVar33);
        auVar46 = vpmovzxbw_avx(auVar46);
        auVar49 = vpmovzxbw_avx(auVar49);
      }
      if ((int)uVar9 < iVar8) {
        auVar53._2_2_ = sVar3;
        auVar53._0_2_ = sVar3;
        auVar53._4_2_ = sVar3;
        auVar53._6_2_ = sVar3;
        auVar53._8_2_ = sVar3;
        auVar53._10_2_ = sVar3;
        auVar53._12_2_ = sVar3;
        auVar53._14_2_ = sVar3;
        auVar55 = vpaddw_avx(auVar53,auVar26);
        auVar54 = auVar28;
        if (upsample_left != 0) {
          auVar54 = vpsllw_avx(auVar55,ZEXT416((uint)upsample_left));
          auVar54 = vpsrlw_avx(auVar54,1);
          auVar54 = vpand_avx(auVar54,auVar33);
        }
        auVar43 = vpsraw_avx(auVar55,ZEXT416(6 - upsample_left));
        auVar55 = vpcmpgtw_avx(auVar24,auVar43);
        auVar55 = vpandn_avx(auVar55,auVar43);
        uVar7 = vpextrw_avx(auVar55,1);
        uVar10 = vpextrw_avx(auVar55,2);
        uVar13 = vpextrw_avx(auVar55,3);
        auVar43 = vpinsrw_avx(ZEXT116(left[auVar55._0_2_]),(uint)left[(short)uVar7],1);
        auVar43 = vpinsrw_avx(auVar43,(uint)left[(short)uVar10],2);
        auVar43 = vpinsrw_avx(auVar43,(uint)left[(short)uVar13],3);
        auVar55 = vpsubw_avx(auVar55,auVar50);
        uVar7 = vpextrw_avx(auVar55,1);
        uVar13 = vpextrw_avx(auVar55,2);
        uVar10 = vpextrw_avx(auVar55,3);
        auVar55 = vpinsrw_avx(ZEXT116(left[auVar55._0_2_]),(uint)left[(short)uVar7],1);
        auVar55 = vpinsrw_avx(auVar55,(uint)left[(short)uVar13],2);
        auVar55 = vpinsrw_avx(auVar55,(uint)left[(short)uVar10],3);
        auVar46 = vpunpcklqdq_avx(auVar46,auVar43);
        auVar49 = vpunpcklqdq_avx(auVar49,auVar55);
        auVar44 = vpunpcklqdq_avx(auVar44,auVar54);
      }
      auVar49 = vpsubw_avx(auVar49,auVar46);
      auVar44 = vpmullw_avx(auVar49,auVar44);
      auVar46 = vpsllw_avx(auVar46,5);
      auVar44 = vpaddw_avx(auVar44,auVar46);
      auVar44 = vpaddw_avx(auVar44,auVar36);
      auVar44 = vpsrlw_avx(auVar44,5);
      auVar44 = vpackuswb_avx(auVar44,auVar44);
      auVar46 = vpshufd_avx(auVar44,0x55);
      auVar44 = vpblendvb_avx(auVar44,auVar46,*(undefined1 (*) [16])BaseMask[uVar18]);
      *(int *)dst = auVar44._0_4_;
      dst = dst + stride;
      sVar3 = sVar3 + 0x40;
      iVar20 = iVar20 - dx;
      iVar19 = iVar19 + dx;
    }
  }
  else {
    auVar25._2_2_ = auVar26._0_2_;
    auVar25._0_2_ = auVar26._0_2_;
    auVar25._4_2_ = auVar26._0_2_;
    auVar25._6_2_ = auVar26._0_2_;
    auVar25._8_2_ = auVar26._0_2_;
    auVar25._10_2_ = auVar26._0_2_;
    auVar25._12_2_ = auVar26._0_2_;
    auVar25._14_2_ = auVar26._0_2_;
    auVar25._16_2_ = auVar26._0_2_;
    auVar25._18_2_ = auVar26._0_2_;
    auVar25._20_2_ = auVar26._0_2_;
    auVar25._22_2_ = auVar26._0_2_;
    auVar25._24_2_ = auVar26._0_2_;
    auVar25._26_2_ = auVar26._0_2_;
    auVar25._28_2_ = auVar26._0_2_;
    auVar25._30_2_ = auVar26._0_2_;
    if (bh < 1) {
      bh = 0;
    }
    auVar27._8_2_ = 0x10;
    auVar27._0_8_ = 0x10001000100010;
    auVar27._10_2_ = 0x10;
    auVar27._12_2_ = 0x10;
    auVar27._14_2_ = 0x10;
    auVar27._16_2_ = 0x10;
    auVar27._18_2_ = 0x10;
    auVar27._20_2_ = 0x10;
    auVar27._22_2_ = 0x10;
    auVar27._24_2_ = 0x10;
    auVar27._26_2_ = 0x10;
    auVar27._28_2_ = 0x10;
    auVar27._30_2_ = 0x10;
    auVar40 = vpmovsxbw_avx2(_DAT_00478960);
    auVar30._8_2_ = 0x7fff;
    auVar30._0_8_ = 0x7fff7fff7fff7fff;
    auVar30._10_2_ = 0x7fff;
    auVar30._12_2_ = 0x7fff;
    auVar30._14_2_ = 0x7fff;
    auVar30._16_2_ = 0x7fff;
    auVar30._18_2_ = 0x7fff;
    auVar30._20_2_ = 0x7fff;
    auVar30._22_2_ = 0x7fff;
    auVar30._24_2_ = 0x7fff;
    auVar30._26_2_ = 0x7fff;
    auVar30._28_2_ = 0x7fff;
    auVar30._30_2_ = 0x7fff;
    auVar38 = vpcmpeqd_avx2(in_ZMM4._0_32_,in_ZMM4._0_32_);
    for (uVar9 = 0; uVar9 != bh; uVar9 = uVar9 + 1) {
      uVar18 = (int)(~uVar9 * dx) >> 6;
      uVar22 = ~uVar18;
      uVar1 = (ushort)(~uVar9 * dx >> 1);
      uVar31 = uVar1 & 0x1f;
      auVar32._0_8_ = CONCAT26(uVar1,CONCAT24(uVar1,CONCAT22(uVar1,uVar1))) & 0x1f001f001f001f;
      auVar32._8_2_ = uVar31;
      auVar32._10_2_ = uVar31;
      auVar32._12_2_ = uVar31;
      auVar32._14_2_ = uVar31;
      auVar32._16_2_ = uVar31;
      auVar32._18_2_ = uVar31;
      auVar32._20_2_ = uVar31;
      auVar32._22_2_ = uVar31;
      auVar32._24_2_ = uVar31;
      auVar32._26_2_ = uVar31;
      auVar32._28_2_ = uVar31;
      auVar32._30_2_ = uVar31;
      auVar34._0_2_ = (undefined2)uVar9;
      auVar34._2_2_ = auVar34._0_2_;
      auVar34._4_2_ = auVar34._0_2_;
      auVar34._6_2_ = auVar34._0_2_;
      auVar34._8_2_ = auVar34._0_2_;
      auVar34._10_2_ = auVar34._0_2_;
      auVar34._12_2_ = auVar34._0_2_;
      auVar34._14_2_ = auVar34._0_2_;
      auVar34._16_2_ = auVar34._0_2_;
      auVar34._18_2_ = auVar34._0_2_;
      auVar34._20_2_ = auVar34._0_2_;
      auVar34._22_2_ = auVar34._0_2_;
      auVar34._24_2_ = auVar34._0_2_;
      auVar34._26_2_ = auVar34._0_2_;
      auVar34._28_2_ = auVar34._0_2_;
      auVar34._30_2_ = auVar34._0_2_;
      auVar35 = vpsllw_avx2(auVar34,6);
      for (lVar12 = 0; lVar12 < bw; lVar12 = lVar12 + 0x10) {
        uVar4 = uVar22 - 1;
        if (-3 < (int)uVar18 + lVar12) {
          uVar4 = 0;
        }
        uVar16 = 0;
        if (0 < (int)uVar22) {
          uVar16 = uVar22;
        }
        if (0xf < (int)uVar16) {
          uVar16 = 0x10;
        }
        auVar29 = (undefined1  [16])0x0;
        auVar28 = (undefined1  [16])0x0;
        if ((int)uVar4 < 0x10) {
          lVar2 = (ulong)uVar4 + (long)(int)uVar18;
          auVar28 = vpshufb_avx(*(undefined1 (*) [16])(above + lVar12 + lVar2),
                                (undefined1  [16])LoadMaskx[uVar4]);
          auVar26 = vpshufb_avx(*(undefined1 (*) [16])(above + lVar12 + 1 + lVar2),
                                (undefined1  [16])LoadMaskx[uVar4]);
          auVar39 = vpmovzxbw_avx2(auVar28);
          auVar37 = vpmovzxbw_avx2(auVar26);
          auVar37 = vpsubw_avx2(auVar37,auVar39);
          auVar37 = vpmullw_avx2(auVar37,auVar32);
          auVar39 = vpsllw_avx2(auVar39,5);
          auVar39 = vpaddw_avx2(auVar39,auVar27);
          auVar39 = vpaddw_avx2(auVar37,auVar39);
          auVar39 = vpsrlw_avx2(auVar39,5);
          auVar28 = vpackuswb_avx(auVar39._0_16_,auVar39._16_16_);
        }
        if ((int)uVar18 < -1) {
          auVar42._0_2_ = (undefined2)lVar12;
          auVar42._2_2_ = auVar42._0_2_;
          auVar42._4_2_ = auVar42._0_2_;
          auVar42._6_2_ = auVar42._0_2_;
          auVar42._8_2_ = auVar42._0_2_;
          auVar42._10_2_ = auVar42._0_2_;
          auVar42._12_2_ = auVar42._0_2_;
          auVar42._14_2_ = auVar42._0_2_;
          auVar42._16_2_ = auVar42._0_2_;
          auVar42._18_2_ = auVar42._0_2_;
          auVar42._20_2_ = auVar42._0_2_;
          auVar42._22_2_ = auVar42._0_2_;
          auVar42._24_2_ = auVar42._0_2_;
          auVar42._26_2_ = auVar42._0_2_;
          auVar42._28_2_ = auVar42._0_2_;
          auVar42._30_2_ = auVar42._0_2_;
          auVar39 = vpaddw_avx2(auVar42,auVar40);
          auVar39 = vpmullw_avx2(auVar39,auVar25);
          auVar39 = vpminuw_avx2(auVar39,auVar30);
          auVar37 = vpsubw_avx2(auVar35,auVar39);
          auVar47 = vpsraw_avx2(auVar37,6);
          auVar39 = vpmaxsw_avx2(auVar47,auVar38);
          iVar8 = vpextrw_avx(auVar39._16_16_,7);
          uVar4 = auVar39._0_4_ - iVar8;
          sVar3 = (short)uVar4;
          if (sVar3 < 0x10) {
            auVar47 = vpshufhw_avx2(auVar39,0xff);
            auVar47 = vpshufd_avx2(auVar47,0xaa);
            auVar47 = vpermq_avx2(auVar47,0xaa);
            auVar39 = vpsubw_avx2(auVar39,auVar47);
            auVar26 = vpmaskmovd_avx2(*(undefined1 (*) [16])
                                       LoadMaskz2
                                       [(short)((int)((uint)(ushort)(sVar3 >> 0xf) << 0x10 |
                                                     uVar4 & 0xffff) / 4)],
                                      *(undefined1 (*) [16])(left + (short)iVar8));
            auVar29 = vpacksswb_avx(auVar39._0_16_,auVar39._16_16_);
            auVar50 = vpmaskmovd_avx2(*(undefined1 (*) [16])
                                       LoadMaskz2
                                       [(short)((int)((uint)(ushort)(sVar3 >> 0xf) << 0x10 |
                                                     uVar4 & 0xffff) / 4)],
                                      *(undefined1 (*) [16])(left + (long)(short)iVar8 + 1));
            auVar26 = vpshufb_avx(auVar26,auVar29);
            auVar29 = vpshufb_avx(auVar50,auVar29);
            auVar45 = vpmovzxbw_avx2(auVar26);
            auVar48 = vpmovzxbw_avx2(auVar29);
          }
          else {
            auVar51._8_2_ = 0xfffe;
            auVar51._0_8_ = 0xfffefffefffefffe;
            auVar51._10_2_ = 0xfffe;
            auVar51._12_2_ = 0xfffe;
            auVar51._14_2_ = 0xfffe;
            auVar51._16_2_ = 0xfffe;
            auVar51._18_2_ = 0xfffe;
            auVar51._20_2_ = 0xfffe;
            auVar51._22_2_ = 0xfffe;
            auVar51._24_2_ = 0xfffe;
            auVar51._26_2_ = 0xfffe;
            auVar51._28_2_ = 0xfffe;
            auVar51._30_2_ = 0xfffe;
            auVar47 = vpcmpgtw_avx2(auVar47,auVar51);
            auVar39 = vpand_avx2(auVar47,auVar39);
            auVar50 = auVar39._0_16_;
            auVar26 = auVar39._16_16_;
            uVar7 = vpextrw_avx(auVar26,1);
            auVar29 = vpinsrw_avx(ZEXT116(left[auVar39._16_2_]),(uint)left[(short)uVar7],1);
            uVar7 = vpextrw_avx(auVar26,2);
            auVar29 = vpinsrw_avx(auVar29,(uint)left[(short)uVar7],2);
            uVar7 = vpextrw_avx(auVar26,3);
            auVar29 = vpinsrw_avx(auVar29,(uint)left[(short)uVar7],3);
            uVar7 = vpextrw_avx(auVar26,4);
            auVar29 = vpinsrw_avx(auVar29,(uint)left[(short)uVar7],4);
            uVar7 = vpextrw_avx(auVar26,5);
            auVar29 = vpinsrw_avx(auVar29,(uint)left[(short)uVar7],5);
            uVar7 = vpextrw_avx(auVar26,6);
            auVar29 = vpinsrw_avx(auVar29,(uint)left[(short)uVar7],6);
            uVar7 = vpextrw_avx(auVar26,7);
            auVar29 = vpinsrw_avx(auVar29,(uint)left[(short)uVar7],7);
            uVar7 = vpextrw_avx(auVar50,1);
            auVar26 = vpinsrw_avx(ZEXT116(left[auVar39._0_2_]),(uint)left[(short)uVar7],1);
            uVar7 = vpextrw_avx(auVar50,2);
            auVar26 = vpinsrw_avx(auVar26,(uint)left[(short)uVar7],2);
            uVar7 = vpextrw_avx(auVar50,3);
            auVar26 = vpinsrw_avx(auVar26,(uint)left[(short)uVar7],3);
            uVar7 = vpextrw_avx(auVar50,4);
            auVar26 = vpinsrw_avx(auVar26,(uint)left[(short)uVar7],4);
            uVar7 = vpextrw_avx(auVar50,5);
            auVar26 = vpinsrw_avx(auVar26,(uint)left[(short)uVar7],5);
            uVar7 = vpextrw_avx(auVar50,6);
            auVar26 = vpinsrw_avx(auVar26,(uint)left[(short)uVar7],6);
            uVar7 = vpextrw_avx(auVar50,7);
            auVar26 = vpinsrw_avx(auVar26,(uint)left[(short)uVar7],7);
            auVar39 = vpsubw_avx2(auVar39,auVar38);
            auVar46 = auVar39._0_16_;
            auVar44 = auVar39._16_16_;
            uVar7 = vpextrw_avx(auVar44,1);
            auVar50 = vpinsrw_avx(ZEXT116(left[auVar39._16_2_]),(uint)left[(short)uVar7],1);
            uVar7 = vpextrw_avx(auVar44,2);
            auVar50 = vpinsrw_avx(auVar50,(uint)left[(short)uVar7],2);
            uVar7 = vpextrw_avx(auVar44,3);
            auVar50 = vpinsrw_avx(auVar50,(uint)left[(short)uVar7],3);
            uVar7 = vpextrw_avx(auVar44,4);
            auVar50 = vpinsrw_avx(auVar50,(uint)left[(short)uVar7],4);
            uVar7 = vpextrw_avx(auVar44,5);
            auVar50 = vpinsrw_avx(auVar50,(uint)left[(short)uVar7],5);
            uVar7 = vpextrw_avx(auVar44,6);
            auVar50 = vpinsrw_avx(auVar50,(uint)left[(short)uVar7],6);
            uVar7 = vpextrw_avx(auVar44,7);
            auVar50 = vpinsrw_avx(auVar50,(uint)left[(short)uVar7],7);
            uVar7 = vpextrw_avx(auVar46,1);
            auVar44 = vpinsrw_avx(ZEXT116(left[auVar39._0_2_]),(uint)left[(short)uVar7],1);
            uVar7 = vpextrw_avx(auVar46,2);
            auVar44 = vpinsrw_avx(auVar44,(uint)left[(short)uVar7],2);
            uVar7 = vpextrw_avx(auVar46,3);
            auVar44 = vpinsrw_avx(auVar44,(uint)left[(short)uVar7],3);
            uVar7 = vpextrw_avx(auVar46,4);
            auVar44 = vpinsrw_avx(auVar44,(uint)left[(short)uVar7],4);
            uVar7 = vpextrw_avx(auVar46,5);
            auVar44 = vpinsrw_avx(auVar44,(uint)left[(short)uVar7],5);
            uVar7 = vpextrw_avx(auVar46,6);
            auVar44 = vpinsrw_avx(auVar44,(uint)left[(short)uVar7],6);
            uVar7 = vpextrw_avx(auVar46,7);
            auVar44 = vpinsrw_avx(auVar44,(uint)left[(short)uVar7],7);
            auVar45._0_16_ = ZEXT116(0) * auVar29 + ZEXT116(1) * auVar26;
            auVar45._16_16_ = ZEXT116(1) * auVar29;
            auVar48._0_16_ = ZEXT116(0) * auVar50 + ZEXT116(1) * auVar44;
            auVar48._16_16_ = ZEXT116(1) * auVar50;
          }
          auVar39 = vpsrlw_avx2(auVar37,1);
          auVar52._8_2_ = 0x1f;
          auVar52._0_8_ = 0x1f001f001f001f;
          auVar52._10_2_ = 0x1f;
          auVar52._12_2_ = 0x1f;
          auVar52._14_2_ = 0x1f;
          auVar52._16_2_ = 0x1f;
          auVar52._18_2_ = 0x1f;
          auVar52._20_2_ = 0x1f;
          auVar52._22_2_ = 0x1f;
          auVar52._24_2_ = 0x1f;
          auVar52._26_2_ = 0x1f;
          auVar52._28_2_ = 0x1f;
          auVar52._30_2_ = 0x1f;
          auVar39 = vpand_avx2(auVar39,auVar52);
          auVar37 = vpsubw_avx2(auVar48,auVar45);
          auVar37 = vpmullw_avx2(auVar37,auVar39);
          auVar39 = vpsllw_avx2(auVar45,5);
          auVar39 = vpaddw_avx2(auVar39,auVar27);
          auVar39 = vpaddw_avx2(auVar37,auVar39);
          auVar39 = vpsrlw_avx2(auVar39,5);
          auVar29 = vpackuswb_avx(auVar39._0_16_,auVar39._16_16_);
        }
        auVar28 = vpblendvb_avx(auVar28,auVar29,*(undefined1 (*) [16])BaseMask[uVar16]);
        *(undefined1 (*) [16])(local_58 + lVar12) = auVar28;
        uVar22 = uVar22 - 0x10;
      }
      local_58 = local_58 + stride;
    }
  }
  return;
}

Assistant:

void av1_dr_prediction_z2_avx2(uint8_t *dst, ptrdiff_t stride, int bw, int bh,
                               const uint8_t *above, const uint8_t *left,
                               int upsample_above, int upsample_left, int dx,
                               int dy) {
  assert(dx > 0);
  assert(dy > 0);
  switch (bw) {
    case 4:
      dr_prediction_z2_Nx4_avx2(bh, dst, stride, above, left, upsample_above,
                                upsample_left, dx, dy);
      break;
    case 8:
      dr_prediction_z2_Nx8_avx2(bh, dst, stride, above, left, upsample_above,
                                upsample_left, dx, dy);
      break;
    default:
      dr_prediction_z2_HxW_avx2(bh, bw, dst, stride, above, left,
                                upsample_above, upsample_left, dx, dy);
      break;
  }
  return;
}